

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhash.h
# Opt level: O0

void __thiscall
QHashPrivate::Span<QHashPrivate::MultiNode<QString,_QDomNodePrivate_*>_>::freeData
          (Span<QHashPrivate::MultiNode<QString,_QDomNodePrivate_*>_> *this)

{
  byte bVar1;
  Data *pDVar2;
  MultiNode<QString,_QDomNodePrivate_*> *pMVar3;
  MultiNode<QString,_QDomNodePrivate_*> *in_RDI;
  uchar o;
  uchar *__end4;
  uchar *__begin4;
  uchar (*__range4) [128];
  MultiNode<QString,_QDomNodePrivate_*> *local_18;
  
  if (in_RDI[4].key.d.d != (Data *)0x0) {
    pMVar3 = in_RDI + 4;
    for (local_18 = in_RDI; local_18 != pMVar3;
        local_18 = (MultiNode<QString,_QDomNodePrivate_*> *)((long)&(local_18->key).d.d + 1)) {
      bVar1 = *(byte *)&(local_18->key).d.d;
      if (bVar1 != 0xff) {
        Entry::node((Entry *)(in_RDI[4].key.d.d + (ulong)bVar1 * 2));
        MultiNode<QString,_QDomNodePrivate_*>::~MultiNode(in_RDI);
      }
    }
    pDVar2 = in_RDI[4].key.d.d;
    if (pDVar2 != (Data *)0x0) {
      operator_delete__(pDVar2);
    }
    in_RDI[4].key.d.d = (Data *)0x0;
  }
  return;
}

Assistant:

void freeData() noexcept(std::is_nothrow_destructible<Node>::value)
    {
        if (entries) {
            if constexpr (!std::is_trivially_destructible<Node>::value) {
                for (auto o : offsets) {
                    if (o != SpanConstants::UnusedEntry)
                        entries[o].node().~Node();
                }
            }
            delete[] entries;
            entries = nullptr;
        }
    }